

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Signal_PDU::GetData(Signal_PDU *this,KOCTET *D,KUINT16 Length)

{
  ushort uVar1;
  KException *this_00;
  const_reference pvVar2;
  ushort local_5a;
  KUINT16 i;
  KUINT16 uiDataSz;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  KOCTET *pKStack_18;
  KUINT16 Length_local;
  KOCTET *D_local;
  Signal_PDU *this_local;
  
  local_1a = Length;
  pKStack_18 = D;
  D_local = (KOCTET *)this;
  if (Length < this->m_ui16DataLength) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"GetData",&local_41);
    KException::KException(this_00,&local_40,1);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  uVar1 = this->m_ui16DataLength;
  for (local_5a = 0; local_5a < uVar1 / 8; local_5a = local_5a + 1) {
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_vData,(ulong)local_5a);
    pKStack_18[local_5a] = *pvVar2;
  }
  return;
}

Assistant:

void Signal_PDU::GetData(KOCTET *D, KUINT16 Length) const noexcept(false)
{
    if( Length < m_ui16DataLength )throw KException( __FUNCTION__, BUFFER_TOO_SMALL );

    // Only return the data, not any padding that may have been added.
    KUINT16 uiDataSz = m_ui16DataLength / 8;
    for( KUINT16 i = 0; i < uiDataSz; ++i )
    {
        D[i] = m_vData[i];
    }
}